

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O2

chain * __thiscall
hashset<hashtableentry<char_*,_int>_>::insert(hashset<hashtableentry<char_*,_int>_> *this,uint h)

{
  chain **ppcVar1;
  chainchunk *pcVar2;
  chainchunk *pcVar3;
  long lVar4;
  bool bVar5;
  
  pcVar3 = (chainchunk *)this->unused;
  if (pcVar3 == (chainchunk *)0x0) {
    pcVar3 = (chainchunk *)operator_new(0x608);
    pcVar3->next = this->chunks;
    this->chunks = pcVar3;
    lVar4 = 0x3f;
    pcVar2 = pcVar3;
    while( true ) {
      bVar5 = lVar4 == 0;
      lVar4 = lVar4 + -1;
      if (bVar5) break;
      pcVar2->chains[0].next = pcVar2->chains + 1;
      pcVar2 = (chainchunk *)(pcVar2->chains + 1);
    }
    pcVar3->chains[0x3f].next = (chain *)0x0;
  }
  this->unused = pcVar3->chains[0].next;
  ppcVar1 = this->chains;
  pcVar3->chains[0].next = ppcVar1[h];
  ppcVar1[h] = pcVar3->chains;
  this->numelems = this->numelems + 1;
  return pcVar3->chains;
}

Assistant:

chain *insert(uint h)
    {
        if(!unused)
        {
            chainchunk *chunk = new chainchunk;
            chunk->next = chunks;
            chunks = chunk;
            loopi(CHUNKSIZE-1) chunk->chains[i].next = &chunk->chains[i+1];
            chunk->chains[CHUNKSIZE-1].next = unused;
            unused = chunk->chains;
        }
        chain *c = unused;
        unused = unused->next;
        c->next = chains[h];
        chains[h] = c;
        numelems++;
        return c;
    }